

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sipc.c
# Opt level: O3

void nn_sipc_init(nn_sipc *self,int src,nn_epbase *epbase,nn_fsm *owner)

{
  nn_fsm_init(&self->fsm,nn_sipc_handler,nn_sipc_shutdown,src,self,owner);
  self->state = 1;
  nn_streamhdr_init(&self->streamhdr,2,&self->fsm);
  self->usock = (nn_usock *)0x0;
  (self->usock_owner).src = -1;
  (self->usock_owner).fsm = (nn_fsm *)0x0;
  nn_pipebase_init(&self->pipebase,&nn_sipc_pipebase_vfptr,epbase);
  self->instate = -1;
  nn_msg_init(&self->inmsg,0);
  self->outstate = -1;
  nn_msg_init(&self->outmsg,0);
  nn_fsm_event_init(&self->done);
  return;
}

Assistant:

void nn_sipc_init (struct nn_sipc *self, int src,
    struct nn_epbase *epbase, struct nn_fsm *owner)
{
    nn_fsm_init (&self->fsm, nn_sipc_handler, nn_sipc_shutdown,
        src, self, owner);
    self->state = NN_SIPC_STATE_IDLE;
    nn_streamhdr_init (&self->streamhdr, NN_SIPC_SRC_STREAMHDR, &self->fsm);
    self->usock = NULL;
    self->usock_owner.src = -1;
    self->usock_owner.fsm = NULL;
    nn_pipebase_init (&self->pipebase, &nn_sipc_pipebase_vfptr, epbase);
    self->instate = -1;
    nn_msg_init (&self->inmsg, 0);
    self->outstate = -1;
    nn_msg_init (&self->outmsg, 0);
    nn_fsm_event_init (&self->done);
}